

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  Report *this_00;
  pointer ppVVar4;
  bool bVar5;
  int extraout_EAX;
  ConstantArray *pCVar6;
  long lVar7;
  undefined4 in_register_00000034;
  long lVar8;
  pointer ppVVar9;
  Value *element;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> values;
  Value *local_70;
  string local_68;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_48;
  
  lVar8 = CONCAT44(in_register_00000034,__fd);
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar1 = *(long *)(lVar8 + 0x48);
  lVar2 = *(long *)(lVar8 + 0x40);
  for (lVar7 = 0; lVar1 - lVar2 >> 3 != lVar7; lVar7 = lVar7 + 1) {
    plVar3 = *(long **)(*(long *)(lVar8 + 0x40) + lVar7 * 8);
    (**(code **)(*plVar3 + 0x10))(plVar3,this);
    local_68._M_dataplus._M_p = (pointer)this->result_;
    std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::push_back
              ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_48,
               (value_type *)&local_68);
  }
  bVar5 = isConstant((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_48);
  if (bVar5) {
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68._M_string_length = 0;
    local_68.field_2._M_allocated_capacity = 0;
    std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::reserve
              ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&local_68,
               (long)local_48._M_impl.super__Vector_impl_data._M_finish -
               (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3);
    ppVVar4 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (ppVVar9 = local_48._M_impl.super__Vector_impl_data._M_start; ppVVar9 != ppVVar4;
        ppVVar9 = ppVVar9 + 1) {
      local_70 = *ppVVar9;
      std::vector<flow::Constant*,std::allocator<flow::Constant*>>::emplace_back<flow::Constant*>
                ((vector<flow::Constant*,std::allocator<flow::Constant*>> *)&local_68,
                 (Constant **)&local_70);
    }
    pCVar6 = IRBuilder::get(&this->super_IRBuilder,
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&local_68
                           );
    this->result_ = (Value *)pCVar6;
    std::_Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>::~_Vector_base
              ((_Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)&local_68);
  }
  else {
    this_00 = this->report_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"VariableSym array elements not allowed.",
               (allocator<char> *)&local_70);
    diagnostics::Report::typeError<>(this_00,(SourceLocation *)(lVar8 + 8),&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    this->result_ = (Value *)0x0;
  }
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(ArrayExpr& arrayExpr) {
  std::vector<Value*> values;
  for (size_t i = 0, e = arrayExpr.values().size(); i != e; ++i) {
    Value* element = codegen(arrayExpr.values()[i].get());
    values.push_back(element);
  }

  if (isConstant(values)) {
    std::vector<Constant*> constants;
    constants.reserve(values.size());
    for (Value* value : values)
      constants.emplace_back(static_cast<Constant*>(value));

    result_ = get(constants);
  } else {
    report_->typeError(arrayExpr.location(), "VariableSym array elements not allowed.");
    result_ = nullptr;
  }
}